

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O1

void test_iterator_generate_data(uint32_t **values_out,uint32_t *count_out)

{
  long lVar1;
  uint32_t *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  uint32_t i;
  int iVar7;
  uint32_t uVar8;
  uint32_t *puVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  puVar9 = (uint32_t *)malloc(4000000);
  puVar9[0] = 0;
  puVar9[1] = 0x4d20000;
  puVar9[2] = 0x4d4ffff;
  uVar14 = 0;
  uVar15 = 1;
  uVar16 = 2;
  uVar17 = 3;
  lVar10 = 3;
  do {
    puVar2 = puVar9 + lVar10;
    *puVar2 = uVar14 | 0x4d60000;
    puVar2[1] = uVar15 | 0x4d60000;
    puVar2[2] = uVar16 | 0x4d60000;
    puVar2[3] = uVar17 | 0x4d60000;
    uVar14 = uVar14 + 4;
    uVar15 = uVar15 + 4;
    uVar16 = uVar16 + 4;
    uVar17 = uVar17 + 4;
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x10003);
  uVar14 = 0;
  uVar15 = 2;
  uVar16 = 4;
  uVar17 = 6;
  lVar10 = 0x10003;
  do {
    puVar2 = puVar9 + lVar10;
    *puVar2 = uVar14 | 0x4d80000;
    puVar2[1] = uVar15 | 0x4d80000;
    puVar2[2] = uVar16 | 0x4d80000;
    puVar2[3] = uVar17 | 0x4d80000;
    uVar14 = uVar14 + 8;
    uVar15 = uVar15 + 8;
    uVar16 = uVar16 + 8;
    uVar17 = uVar17 + 8;
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x18003);
  uVar14 = 1;
  uVar15 = 3;
  uVar16 = 5;
  uVar17 = 7;
  lVar10 = 0x18003;
  do {
    puVar2 = puVar9 + lVar10;
    *puVar2 = uVar14 | 0x4da0000;
    puVar2[1] = uVar15 | 0x4da0000;
    puVar2[2] = uVar16 | 0x4da0000;
    puVar2[3] = uVar17 | 0x4da0000;
    auVar5 = _DAT_00135100;
    auVar4 = _DAT_001350f0;
    auVar3 = _DAT_001350e0;
    uVar14 = uVar14 + 8;
    uVar15 = uVar15 + 8;
    uVar16 = uVar16 + 8;
    uVar17 = uVar17 + 8;
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x20003);
  lVar10 = 0x20006;
  lVar12 = -0x100f4;
  do {
    lVar1 = lVar10 + -0x20006;
    auVar18._8_4_ = (int)lVar1;
    auVar18._0_8_ = lVar1;
    auVar18._12_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar19 = (auVar18 | auVar4) ^ auVar5;
    iVar7 = (int)lVar12;
    if (auVar19._4_4_ == -0x80000000 && auVar19._0_4_ < -0x7ffffc0f) {
      puVar9[lVar10 + -3] = iVar7 + 0x4dd00f4;
      puVar9[lVar10 + -2] = iVar7 + 0x4dd0135;
    }
    auVar18 = (auVar18 | auVar3) ^ auVar5;
    if (auVar18._4_4_ == -0x80000000 && auVar18._0_4_ < -0x7ffffc0f) {
      puVar9[lVar10 + -1] = iVar7 + 0x4dd0176;
      puVar9[lVar10] = iVar7 + 0x4dd01b7;
    }
    lVar10 = lVar10 + 4;
    lVar12 = lVar12 + 0x104;
  } while (lVar12 != 0);
  uVar13 = 0x203f4;
  iVar11 = 0;
  iVar7 = 0;
  do {
    iVar6 = iVar11 + 1;
    if (iVar7 != ((uint)((iVar11 + 2) * (iVar11 + 1)) >> 1) - 1) {
      puVar9[uVar13] = iVar7 + 0x4de0000;
      uVar13 = (ulong)((int)uVar13 + 1);
      iVar6 = iVar11;
    }
    iVar11 = iVar6;
    iVar7 = iVar7 + 1;
  } while (iVar7 != 0x10000);
  iVar7 = 0;
  do {
    iVar11 = (int)uVar13;
    puVar9[(uint)(iVar11 + iVar7)] = iVar7 + 0x4e0ff9c;
    iVar7 = iVar7 + 1;
  } while (iVar7 != 100);
  iVar7 = 0;
  do {
    puVar9[(uint)(iVar11 + 100 + iVar7)] = iVar7 + 0x4e10000;
    iVar7 = iVar7 + 1;
  } while (iVar7 != 0x10000);
  uVar14 = iVar11 + 0x10064;
  uVar8 = 0x4e20000;
  do {
    uVar13 = (ulong)uVar14;
    uVar14 = uVar14 + 1;
    puVar9[uVar13] = uVar8;
    uVar8 = uVar8 + 1;
  } while (uVar8 != 0x4e20064);
  uVar15 = 0;
  do {
    uVar16 = uVar14;
    puVar9[uVar16] = uVar15 | 0x4e40000;
    seed = seed * 0x41c64e6d + 0x3039;
    uVar15 = uVar15 + (seed & 0x3fffffff) % 10 + 1;
    uVar14 = uVar16 + 1;
  } while (uVar15 < 0x10000);
  puVar9[uVar16 + 1] = 0xffffffff;
  _assert_true((ulong)(uVar16 + 2 < 0xf4241),"count <= capacity",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xf58);
  *values_out = puVar9;
  *count_out = uVar16 + 2;
  return;
}

Assistant:

void test_iterator_generate_data(uint32_t **values_out, uint32_t *count_out) {
    const size_t capacity = 1000 * 1000;
    uint32_t *values =
        (uint32_t *)malloc(sizeof(uint32_t) * capacity);  // ascending order
    uint32_t count = 0;
    uint32_t base = 1234;  // container index

    // min allowed value
    values[count++] = 0;

    // only the very first value in container is set
    values[count++] = base * 65536;
    base += 2;

    // only the very last value in container is set
    values[count++] = base * 65536 + 65535;
    base += 2;

    // fully filled container
    for (uint32_t i = 0; i < 65536; i++) {
        values[count++] = base * 65536 + i;
    }
    base += 2;

    // even values
    for (uint32_t i = 0; i < 65536; i += 2) {
        values[count++] = base * 65536 + i;
    }
    base += 2;

    // odd values
    for (uint32_t i = 1; i < 65536; i += 2) {
        values[count++] = base * 65536 + i;
    }
    base += 2;

    // each next 64-bit word is ROR'd by one
    for (uint32_t i = 0; i < 65536; i += 65) {
        values[count++] = base * 65536 + i;
    }
    base += 2;

    // runs of increasing length: 0, 1,0, 1,1,0, 1,1,1,0, ...
    for (uint32_t i = 0, run_index = 0; i < 65536; i++) {
        if (i != (run_index + 1) * (run_index + 2) / 2 - 1) {
            values[count++] = base * 65536 + i;
        } else {
            run_index++;
        }
    }
    base += 2;

    // 00000XX, XXXXXX, XX0000
    for (uint32_t i = 65536 - 100; i < 65536; i++) {
        values[count++] = base * 65536 + i;
    }
    base += 1;
    for (uint32_t i = 0; i < 65536; i++) {
        values[count++] = base * 65536 + i;
    }
    base += 1;
    for (uint32_t i = 0; i < 100; i++) {
        values[count++] = base * 65536 + i;
    }
    base += 2;

    // random
    for (int i = 0; i < 65536; i += our_rand() % 10 + 1) {
        values[count++] = base * 65536 + i;
    }
    base += 2;

    // max allowed value
    values[count++] = UINT32_MAX;

    assert_true(count <= capacity);
    *values_out = values;
    *count_out = count;
}